

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  pointer pTVar3;
  pointer pEVar4;
  ExprList *this_00;
  reference pvVar5;
  pointer pTVar6;
  size_type sVar7;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_268;
  Enum local_260;
  Enum local_25c;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_258;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> field_1;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_248;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_240;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> table_field;
  undefined1 local_230 [8];
  ElemExpr elem_expr;
  Const local_1b8;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_170;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_168;
  Location local_160;
  Var local_140;
  ElemSegment *local_f8;
  ElemSegment *elem_segment;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  elem_segment_field;
  Type local_dc;
  Type elem_type;
  Location local_d0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_b0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> field;
  unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> local_98;
  unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> import;
  undefined1 local_88 [8];
  ModuleFieldList export_fields;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  RVar2 = Expect(this,Table);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)&export_fields.size_);
  ParseBindVarOpt(this,(string *)&export_fields.size_);
  intrusive_list<wabt::ModuleField>::intrusive_list((intrusive_list<wabt::ModuleField> *)local_88);
  import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
  .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
  super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_ =
       ParseInlineExports(this,(ModuleFieldList *)local_88,Table);
  bVar1 = Failed(import._M_t.
                 super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>
                 .super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
    super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_00282a3d;
  }
  bVar1 = PeekMatchLpar(this,Import);
  if (bVar1) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::TableImport,std::__cxx11::string&>
              ((wabt *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &export_fields.size_);
    pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::get
                       (&local_98);
    RVar2 = ParseInlineImport(this,(Import *)pTVar3);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
               operator->(&local_98);
      RVar2 = ParseLimits(this,&(pTVar3->table).elem_limits);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
                 operator->(&local_98);
        field._M_t.
        super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_ =
             ParseRefType(this,&(pTVar3->table).elem_type);
        bVar1 = Failed(field._M_t.
                       super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          GetLocation(&local_d0,this);
          MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
                    ((wabt *)&local_b0,&local_98,&local_d0);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                      *)&stack0xffffffffffffff28,&local_b0);
          Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                      *)&stack0xffffffffffffff28);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                       *)&stack0xffffffffffffff28);
          std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
          ~unique_ptr(&local_b0);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 0;
        }
      }
    }
    std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::~unique_ptr
              (&local_98);
  }
  else {
    bVar1 = PeekMatch(this,First_Type);
    if (bVar1) {
      RVar2 = ParseRefType(this,&local_dc);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_00282a3d;
      }
      elem_segment_field._M_t.
      super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl._4_4_ =
           Expect(this,Lpar);
      bVar1 = Failed(elem_segment_field._M_t.
                     super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                     .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl.
                     _4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_00282a3d;
      }
      elem_segment_field._M_t.
      super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl._0_4_ =
           Expect(this,Elem);
      bVar1 = Failed(elem_segment_field._M_t.
                     super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                     .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl.
                     _0_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_00282a3d;
      }
      MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&>
                ((wabt *)&elem_segment,(Location *)local_48);
      pEVar4 = std::
               unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
               ::operator->((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                             *)&elem_segment);
      local_f8 = &pEVar4->elem_segment;
      sVar7 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&module->tables);
      Location::Location(&local_160);
      Var::Var(&local_140,(Index)sVar7,&local_160);
      Var::operator=(&local_f8->table_var,&local_140);
      Var::~Var(&local_140);
      this_00 = &local_f8->offset;
      Location::Location((Location *)&elem_expr.type);
      Const::I32(&local_1b8,0,(Location *)&elem_expr.type);
      MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_170,&local_1b8);
      std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
      unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
                ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_168,&local_170);
      intrusive_list<wabt::Expr>::push_back(this_00,&local_168);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_168);
      std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr
                (&local_170);
      pvVar5 = intrusive_list<wabt::Expr>::back(&local_f8->offset);
      (pvVar5->loc).filename.data_ = (char *)local_48;
      (pvVar5->loc).filename.size_ = (size_type)loc.filename.data_;
      (pvVar5->loc).field_1.field_1.offset = loc.filename.size_;
      ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
      ((long)&(pvVar5->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
      (local_f8->elem_type).enum_ = local_dc.enum_;
      ElemExpr::ElemExpr((ElemExpr *)local_230);
      bVar1 = ParseElemExprOpt(this,(ElemExpr *)local_230);
      if (bVar1) {
        std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::push_back
                  (&local_f8->elem_exprs,(value_type *)local_230);
        ParseElemExprListOpt(this,&local_f8->elem_exprs);
      }
      else {
        ParseElemExprVarListOpt(this,&local_f8->elem_exprs);
      }
      table_field._M_t.
      super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>.
      _M_t.
      super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
      .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl._4_4_ = Expect(this,Rpar)
      ;
      bVar1 = Failed(table_field._M_t.
                     super___uniq_ptr_impl<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::TableModuleField_*,_std::default_delete<wabt::TableModuleField>_>
                     .super__Head_base<0UL,_wabt::TableModuleField_*,_false>._M_head_impl._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        MakeUnique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                  ((wabt *)&local_240,(Location *)local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &export_fields.size_);
        sVar7 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::size
                          (&local_f8->elem_exprs);
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->(&local_240);
        (pTVar6->table).elem_limits.initial = sVar7;
        sVar7 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::size
                          (&local_f8->elem_exprs);
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->(&local_240);
        (pTVar6->table).elem_limits.max = sVar7;
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->(&local_240);
        (pTVar6->table).elem_limits.has_max = true;
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->(&local_240);
        (pTVar6->table).elem_type.enum_ = local_dc.enum_;
        std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
        unique_ptr(&local_248,&local_240);
        Module::AppendField(module,&local_248);
        std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
        ~unique_ptr(&local_248);
        std::
        unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
        ::unique_ptr((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)&field_1,
                     (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)&elem_segment);
        Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                    *)&field_1);
        std::
        unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
        ::~unique_ptr((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                       *)&field_1);
        std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
        ~unique_ptr(&local_240);
      }
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._1_3_ = 0;
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_1_ = bVar1;
      ElemExpr::~ElemExpr((ElemExpr *)local_230);
      std::
      unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>::
      ~unique_ptr((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                   *)&elem_segment);
    }
    else {
      MakeUnique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((wabt *)&local_258,(Location *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &export_fields.size_);
      pTVar6 = std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
               ::operator->(&local_258);
      local_25c = (Enum)ParseLimits(this,&(pTVar6->table).elem_limits);
      bVar1 = Failed((Result)local_25c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        pTVar6 = std::
                 unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                 operator->(&local_258);
        local_260 = (Enum)ParseRefType(this,&(pTVar6->table).elem_type);
        bVar1 = Failed((Result)local_260);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
          unique_ptr(&local_268,&local_258);
          Module::AppendField(module,&local_268);
          std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
          ~unique_ptr(&local_268);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 0;
        }
      }
      std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
      ~unique_ptr(&local_258);
    }
  }
  if ((uint)import._M_t.
            super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
            super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl == 0) {
    sVar7 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&module->tables);
    anon_unknown_1::AppendInlineExportFields(module,(ModuleFieldList *)local_88,(int)sVar7 - 1);
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
LAB_00282a3d:
  intrusive_list<wabt::ModuleField>::~intrusive_list((intrusive_list<wabt::ModuleField> *)local_88);
  std::__cxx11::string::~string((string *)&export_fields.size_);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (PeekMatch(TokenType::ValueType)) {
    Type elem_type;
    CHECK_RESULT(ParseRefType(&elem_type));

    EXPECT(Lpar);
    EXPECT(Elem);

    auto elem_segment_field = MakeUnique<ElemSegmentModuleField>(loc);
    ElemSegment& elem_segment = elem_segment_field->elem_segment;
    elem_segment.table_var = Var(module->tables.size());
    elem_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    elem_segment.offset.back().loc = loc;
    elem_segment.elem_type = elem_type;
    // Syntax is either an optional list of var (legacy), or a non-empty list
    // of elem expr.
    ElemExpr elem_expr;
    if (ParseElemExprOpt(&elem_expr)) {
      elem_segment.elem_exprs.push_back(elem_expr);
      // Parse the rest.
      ParseElemExprListOpt(&elem_segment.elem_exprs);
    } else {
      ParseElemExprVarListOpt(&elem_segment.elem_exprs);
    }
    EXPECT(Rpar);

    auto table_field = MakeUnique<TableModuleField>(loc, name);
    table_field->table.elem_limits.initial = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.max = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.has_max = true;
    table_field->table.elem_type = elem_type;
    module->AppendField(std::move(table_field));
    module->AppendField(std::move(elem_segment_field));
  } else {
    auto field = MakeUnique<TableModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->table.elem_limits));
    CHECK_RESULT(ParseRefType(&field->table.elem_type));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}